

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O3

void __thiscall
SocketReceiveMultiplexer::Implementation::AttachPeriodicTimerListener
          (Implementation *this,int initialDelayMilliseconds,int periodMilliseconds,
          TimerListener *listener)

{
  pointer *ppAVar1;
  iterator __position;
  AttachedTimerListener local_10;
  
  __position._M_current =
       (this->timerListeners_).
       super__Vector_base<AttachedTimerListener,_std::allocator<AttachedTimerListener>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->timerListeners_).
      super__Vector_base<AttachedTimerListener,_std::allocator<AttachedTimerListener>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_10.initialDelayMs = initialDelayMilliseconds;
    local_10.periodMs = periodMilliseconds;
    local_10.listener = listener;
    std::vector<AttachedTimerListener,_std::allocator<AttachedTimerListener>_>::
    _M_realloc_insert<AttachedTimerListener>(&this->timerListeners_,__position,&local_10);
  }
  else {
    (__position._M_current)->initialDelayMs = initialDelayMilliseconds;
    (__position._M_current)->periodMs = periodMilliseconds;
    (__position._M_current)->listener = listener;
    ppAVar1 = &(this->timerListeners_).
               super__Vector_base<AttachedTimerListener,_std::allocator<AttachedTimerListener>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppAVar1 = *ppAVar1 + 1;
  }
  return;
}

Assistant:

void AttachPeriodicTimerListener( int initialDelayMilliseconds, int periodMilliseconds, TimerListener *listener )
	{
		timerListeners_.push_back( AttachedTimerListener( initialDelayMilliseconds, periodMilliseconds, listener ) );
	}